

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recycle.c
# Opt level: O1

void free_pcdata(PC_DATA *pcdata)

{
  long lVar1;
  
  if ((pcdata != (PC_DATA *)0x0) && (pcdata->valid == true)) {
    free_pstring(pcdata->pwd);
    free_pstring(pcdata->bamfin);
    free_pstring(pcdata->bamfout);
    free_pstring(pcdata->title);
    free_buf(pcdata->buffer);
    lVar1 = 0x16;
    do {
      if ((&pcdata->next)[lVar1] != (PC_DATA *)0x0) {
        free_pstring((char *)(&pcdata->next)[lVar1]);
      }
      lVar1 = lVar1 + 1;
    } while (lVar1 != 0x7a);
    pcdata->valid = false;
    pcdata->next = pcdata_free;
    pcdata_free = pcdata;
  }
  return;
}

Assistant:

void free_pcdata(PC_DATA *pcdata)
{
	if (!(pcdata != nullptr && pcdata->valid))
		return;

	free_pstring(pcdata->pwd);
	free_pstring(pcdata->bamfin);
	free_pstring(pcdata->bamfout);
	free_pstring(pcdata->title);
	free_buf(pcdata->buffer);

	for (int i = 0; i < 100; i++)
	{
		if (pcdata->recentkills[i] != nullptr)
			free_pstring(pcdata->recentkills[i]);
	}

	/*
	for (alias = 0; alias < MAX_ALIAS; alias++)
	{
		if(pcdata->alias[alias] != nullptr)
		{
			free_pstring(pcdata->alias[alias]);
			free_pstring(pcdata->alias_sub[alias]);
		}
	}
	*/

	pcdata->valid = false;

	pcdata->next = pcdata_free;
	pcdata_free = pcdata;
}